

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_float,_float,_float,_float,_float,_float,_int,_unsigned_long>
* fmt::v7::
  make_args_checked<int,float&,float&,float&,float&,float&,float&,int,unsigned_long,char[55],char>
            (char (*format_str) [55],remove_reference_t<int> *args,
            remove_reference_t<float_&> *args_1,remove_reference_t<float_&> *args_2,
            remove_reference_t<float_&> *args_3,remove_reference_t<float_&> *args_4,
            remove_reference_t<float_&> *args_5,remove_reference_t<float_&> *args_6,
            remove_reference_t<int> *args_7,remove_reference_t<unsigned_long> *args_8)

{
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_float,_float,_float,_float,_float,_float,_int,_unsigned_long>
  *in_RDI;
  int *in_stack_00000058;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_float,_float,_float,_float,_float,_float,_int,_unsigned_long>
  *in_stack_00000060;
  float *in_stack_00000120;
  float *in_stack_00000128;
  int *in_stack_00000130;
  unsigned_long *in_stack_00000138;
  
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_float,_float,_float,_float,_float,_float,_int,_unsigned_long>
  ::format_arg_store(in_stack_00000060,in_stack_00000058,(float *)format_str,(float *)args,args_1,
                     args_2,in_stack_00000120,in_stack_00000128,in_stack_00000130,in_stack_00000138)
  ;
  return in_RDI;
}

Assistant:

inline auto make_args_checked(const S& format_str,
                              const remove_reference_t<Args>&... args)
    -> format_arg_store<buffer_context<Char>, remove_reference_t<Args>...> {
  static_assert(
      detail::count<(
              std::is_base_of<detail::view, remove_reference_t<Args>>::value &&
              std::is_reference<Args>::value)...>() == 0,
      "passing views as lvalues is disallowed");
  detail::check_format_string<Args...>(format_str);
  return {args...};
}